

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  bool bVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  Curl_easy *data;
  ulong uVar7;
  char *pcVar8;
  char separator [4];
  Curl_dns_entry *addr;
  uint num;
  undefined4 local_15c;
  uint local_158;
  int local_154;
  Curl_dns_entry *local_150;
  Curl_easy *local_148;
  connectdata *local_140;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c [63];
  
  data = conn->data;
  local_150 = (Curl_dns_entry *)0x0;
  pcVar8 = (data->state).buffer + 4;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (conn->proto).ftpc.newhost = (char *)0x0;
  iVar2 = (conn->proto).ftpc.count1;
  if (ftpcode == 0xe5 && iVar2 == 0) {
    pcVar4 = strchr(pcVar8,0x28);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = pcVar4 + 1;
      iVar2 = __isoc99_sscanf(pcVar4,"%c%c%c%u%c",&local_15c,(long)&local_15c + 1,
                              (long)&local_15c + 2,&local_138,(long)&local_15c + 3);
      bVar1 = true;
      if (iVar2 == 5) {
        lVar5 = 1;
        do {
          if (*(char *)((long)&local_15c + lVar5) != (char)local_15c) {
            pcVar4 = (char *)0x0;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        if (local_138 < 0x10000) {
          if (pcVar4 != (char *)0x0) {
            (conn->proto).ftpc.newport = (unsigned_short)local_138;
            if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
              pcVar6 = conn->ip_addr_str;
            }
            else {
              pcVar6 = (conn->host).name;
            }
            pcVar6 = (*Curl_cstrdup)(pcVar6);
            (conn->proto).ftpc.newhost = pcVar6;
            if (pcVar6 == (char *)0x0) {
              pcVar8 = (char *)0x1b;
              bVar1 = false;
            }
          }
        }
        else {
          bVar1 = false;
          Curl_failf(data,"Illegal port number in EPSV reply");
          pcVar8 = (char *)0xd;
        }
      }
      else {
        pcVar4 = (char *)0x0;
      }
      CVar3 = (CURLcode)pcVar8;
      if (!bVar1) goto LAB_004a15af;
    }
    CVar3 = (CURLcode)pcVar8;
    bVar1 = true;
    if (pcVar4 == (char *)0x0) {
      bVar1 = false;
      Curl_failf(data,"Weirdly formatted EPSV reply");
      CVar3 = CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (ftpcode != 0xe3 || iVar2 != 1) {
      if (iVar2 != 0) {
        Curl_failf(data,"Bad PASV/EPSV response: %03d",(ulong)(uint)ftpcode);
        return CURLE_FTP_WEIRD_PASV_REPLY;
      }
      CVar3 = ftp_epsv_disable(conn);
      return CVar3;
    }
    local_154 = ftpcode;
    local_148 = data;
    local_140 = conn;
    if (*pcVar8 != '\0') {
      pcVar4 = pcVar8;
      do {
        iVar2 = __isoc99_sscanf(pcVar4,"%u,%u,%u,%u,%u,%u",&local_138,&local_134,&local_130,
                                local_12c,&local_15c,&local_158);
        pcVar8 = pcVar4;
        if (iVar2 == 6) break;
        pcVar8 = pcVar4 + 1;
        pcVar6 = pcVar4 + 1;
        pcVar4 = pcVar8;
      } while (*pcVar6 != '\0');
    }
    conn = local_140;
    data = local_148;
    ftpcode = local_154;
    CVar3 = (CURLcode)pcVar8;
    if (((((*pcVar8 == '\0') || (0xff < local_138)) || (0xff < local_134)) ||
        ((0xff < local_130 || (0xff < local_12c[0])))) || ((0xff < local_15c || (0xff < local_158)))
       ) {
      bVar1 = false;
      Curl_failf(local_148,"Couldn\'t interpret the 227-response");
      CVar3 = CURLE_FTP_WEIRD_227_FORMAT;
      conn = local_140;
      ftpcode = local_154;
      goto LAB_004a15b1;
    }
    if ((local_148->set).ftp_skip_ip == true) {
      Curl_infof(local_148,"Skip %u.%u.%u.%u for data connection, re-use %s instead\n");
      if (((conn->bits).tunnel_proxy == false) && ((conn->bits).socksproxy != true)) {
        pcVar8 = conn->ip_addr_str;
      }
      else {
        pcVar8 = (conn->host).name;
      }
      pcVar8 = (*Curl_cstrdup)(pcVar8);
    }
    else {
      pcVar8 = curl_maprintf("%u.%u.%u.%u",(ulong)local_138,(ulong)local_134,(ulong)local_130,
                             (ulong)local_12c[0]);
    }
    (conn->proto).ftpc.newhost = pcVar8;
    if (pcVar8 != (char *)0x0) {
      (conn->proto).ftpc.newport = (short)(local_15c << 8) + (short)local_158;
      bVar1 = true;
      goto LAB_004a15b1;
    }
    CVar3 = CURLE_OUT_OF_MEMORY;
LAB_004a15af:
    bVar1 = false;
  }
LAB_004a15b1:
  if (bVar1) {
    if ((conn->bits).proxy == true) {
      pcVar8 = *(char **)((long)&(conn->socks_proxy).host.name +
                         (ulong)(((conn->bits).socksproxy ^ 1) << 6));
      local_154 = ftpcode;
      Curl_resolv(conn,pcVar8,(int)conn->port,&local_150);
      uVar7 = conn->port;
      ftpcode = local_154;
      if (local_150 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve proxy host %s:%hu",pcVar8,uVar7 & 0xffff);
        return CURLE_COULDNT_RESOLVE_PROXY;
      }
    }
    else {
      Curl_resolv(conn,(conn->proto).ftpc.newhost,(uint)(conn->proto).ftpc.newport,&local_150);
      uVar7 = (ulong)(conn->proto).ftpc.newport;
      if (local_150 == (Curl_dns_entry *)0x0) {
        Curl_failf(data,"Can\'t resolve new host %s:%hu",(conn->proto).ftpc.newhost,uVar7);
        return CURLE_FTP_CANT_GET_HOST;
      }
    }
    (conn->bits).tcpconnect[1] = false;
    CVar3 = Curl_connecthost(conn,local_150);
    if (CVar3 == CURLE_OK) {
      if ((data->set).verbose == true) {
        pcVar8 = (conn->proto).ftpc.newhost;
        Curl_printable_address(local_150->addr,(char *)&local_138,0x100);
        Curl_infof(conn->data,"Connecting to %s (%s) port %d\n",pcVar8,&local_138,uVar7 & 0xffff);
      }
      Curl_resolv_unlock(data,local_150);
      (*Curl_cfree)(conn->secondaryhostname);
      conn->secondaryhostname = (char *)0x0;
      conn->secondary_port = (conn->proto).ftpc.newport;
      pcVar8 = (*Curl_cstrdup)((conn->proto).ftpc.newhost);
      conn->secondaryhostname = pcVar8;
      if (pcVar8 == (char *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        (conn->bits).do_more = true;
        (conn->proto).ftpc.state = FTP_STOP;
        CVar3 = CURLE_OK;
      }
    }
    else {
      Curl_resolv_unlock(data,local_150);
      if ((ftpcode == 0xe5) && ((conn->proto).ftpc.count1 == 0)) {
        CVar3 = ftp_epsv_disable(conn);
      }
    }
  }
  return CVar3;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct Curl_dns_entry *addr = NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str = &data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i = 1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr = NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[4];
    unsigned int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%u,%u,%u,%u,%u,%u",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str || (ip[0] > 255) || (ip[1] > 255)  || (ip[2] > 255)  ||
       (ip[3] > 255) || (port[0] > 255)  || (port[1] > 255) ) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(conn, host_name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}